

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_1::PosixSequentialFile::~PosixSequentialFile(PosixSequentialFile *this)

{
  PosixSequentialFile *this_local;
  
  (this->super_SequentialFile)._vptr_SequentialFile =
       (_func_int **)&PTR__PosixSequentialFile_0015fc18;
  fclose((FILE *)this->file_);
  std::__cxx11::string::~string((string *)&this->filename_);
  SequentialFile::~SequentialFile(&this->super_SequentialFile);
  return;
}

Assistant:

virtual ~PosixSequentialFile() { fclose(file_); }